

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mchain_details.hpp
# Opt level: O3

void __thiscall
so_5::mchain_props::
mchain_template<so_5::mchain_props::details::unlimited_demand_queue,_so_5::impl::msg_tracing_helpers::mchain_tracing_disabled_base>
::remove_from_select
          (mchain_template<so_5::mchain_props::details::unlimited_demand_queue,_so_5::impl::msg_tracing_helpers::mchain_tracing_disabled_base>
           *this,select_case_t *select_case)

{
  int iVar1;
  select_case_t *psVar2;
  select_case_t *psVar3;
  select_case_t *psVar4;
  
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)&this->m_lock);
  if (iVar1 != 0) {
    std::__throw_system_error(iVar1);
  }
  psVar3 = this->m_select_tail;
  psVar2 = (select_case_t *)0x0;
  do {
    psVar4 = psVar2;
    psVar2 = psVar3;
    if (psVar2 == (select_case_t *)0x0) goto LAB_0020d747;
    psVar3 = *(select_case_t **)(psVar2 + 0x18);
  } while (psVar2 != select_case);
  psVar3 = psVar4 + 0x18;
  if (psVar4 == (select_case_t *)0x0) {
    psVar3 = (select_case_t *)&this->m_select_tail;
  }
  *(select_case_t **)psVar3 = *(select_case_t **)(psVar2 + 0x18);
LAB_0020d747:
  pthread_mutex_unlock((pthread_mutex_t *)&this->m_lock);
  return;
}

Assistant:

virtual void
		remove_from_select(
			select_case_t & select_case ) override
			{
				std::lock_guard< std::mutex > lock{ m_lock };

				select_case_t * c = m_select_tail;
				select_case_t * prev = nullptr;
				while( c )
					{
						select_case_t * const next = c->query_next();
						if( c == &select_case )
							{
								if( prev )
									prev->set_next( next );
								else
									m_select_tail = next;

								return;
							}

						prev = c;
						c = next;
					}
			}